

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O1

ssize_t __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  value_type *__val;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t sVar4;
  long lVar5;
  ulong uVar6;
  vector<char,_std::allocator<char>_> glowable_buf;
  array<char,_2048UL> buf;
  vector<char,_std::allocator<char>_> local_858;
  Stream *local_838;
  char local_830 [2048];
  
  uVar2 = snprintf(local_830,0x7ff,fmt,*args,*args_1);
  if ((int)uVar2 < 1) {
    sVar4 = (ssize_t)(int)uVar2;
  }
  else {
    uVar6 = (ulong)uVar2;
    if (uVar2 < 0x7ff) {
      iVar3 = (*this->_vptr_Stream[5])(this,local_830,uVar6);
      sVar4 = CONCAT44(extraout_var,iVar3);
    }
    else {
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_838 = this;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x800);
      pcVar1 = local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x800;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar1;
      memset(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x800);
      lVar5 = (long)pcVar1 -
              (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar1;
      if (lVar5 - 1U <= uVar6) {
        do {
          std::vector<char,_std::allocator<char>_>::resize(&local_858,lVar5 * 2);
          iVar3 = snprintf(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (size_t)(local_858.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_finish +
                                   ~(ulong)local_858.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start),fmt,*args,
                           *args_1);
          uVar6 = (ulong)iVar3;
          lVar5 = (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
        } while (lVar5 - 1U <= uVar6);
      }
      iVar3 = (*local_838->_vptr_Stream[5])
                        (local_838,
                         local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar6);
      sVar4 = CONCAT44(extraout_var_00,iVar3);
      if (local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return sVar4;
}

Assistant:

inline ssize_t Stream::write_format(const char* fmt, const Args &... args) {
        const auto bufsiz = 2048;
        std::array<char, bufsiz> buf;

#if defined(_MSC_VER) && _MSC_VER < 1900
        auto sn = _snprintf_s(buf.data(), bufsiz - 1, buf.size() - 1, fmt, args...);
#else
        auto sn = snprintf(buf.data(), buf.size() - 1, fmt, args...);
#endif
        if (sn <= 0) { return sn; }

        auto n = static_cast<size_t>(sn);

        if (n >= buf.size() - 1) {
            std::vector<char> glowable_buf(buf.size());

            while (n >= glowable_buf.size() - 1) {
                glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
                n = static_cast<size_t>(_snprintf_s(&glowable_buf[0], glowable_buf.size(),
                    glowable_buf.size() - 1, fmt,
                    args...));
#else
                n = static_cast<size_t>(
                    snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...));
#endif
            }
            return write(&glowable_buf[0], n);
        }
        else {
            return write(buf.data(), n);
        }
    }